

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

QString * qt_setWindowTitle_helperHelper
                    (QString *__return_storage_ptr__,QString *title,QWidget *widget)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  QStyle *pQVar5;
  bool bVar6;
  long lVar7;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QArrayDataPointer<char16_t>::QArrayDataPointer(&__return_storage_ptr__->d,&title->d);
  if ((__return_storage_ptr__->d).size != 0) {
    uVar1 = QString::indexOf((QLatin1String *)__return_storage_ptr__,3,0x5ea6f4);
    while (uVar1 != 0xffffffff) {
      lVar7 = (ulong)uVar1 << 0x20;
      bVar6 = false;
      do {
        lVar7 = lVar7 + 0x300000000;
        lVar4 = QString::indexOf((QLatin1String *)__return_storage_ptr__,3,0x5ea6f4);
        bVar6 = (bool)(bVar6 ^ 1);
      } while (lVar4 == lVar7 >> 0x20);
      if (bVar6) {
        iVar2 = QString::lastIndexOf((QLatin1String *)__return_storage_ptr__,3,0x5ea6f4);
        if ((*(byte *)(*(long *)&widget->field_0x8 + 0x241) & 2) != 0) {
          pQVar5 = QWidget::style(widget);
          iVar3 = (**(code **)(*(long *)pQVar5 + 0xf0))(pQVar5,0x30,0,widget,0);
          if (iVar3 != 0) {
            QWidget::tr((QString *)&local_50,"*",(char *)0x0,-1);
            QString::replace((longlong)__return_storage_ptr__,(long)iVar2,(QString *)0x3);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
            goto LAB_002f9ff3;
          }
        }
        QString::remove((longlong)__return_storage_ptr__,(long)iVar2);
      }
LAB_002f9ff3:
      uVar1 = QString::indexOf((QLatin1String *)__return_storage_ptr__,3,0x5ea6f4);
    }
    QString::replace((QLatin1String *)__return_storage_ptr__,(QLatin1String *)0x6,0x5ea6f1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString qt_setWindowTitle_helperHelper(const QString &title, const QWidget *widget)
{
    Q_ASSERT(widget);

    QString cap = title;
    if (cap.isEmpty())
        return cap;

    const auto placeHolder = "[*]"_L1;
    int index = cap.indexOf(placeHolder);

    // here the magic begins
    while (index != -1) {
        index += placeHolder.size();
        int count = 1;
        while (cap.indexOf(placeHolder, index) == index) {
            ++count;
            index += placeHolder.size();
        }

        if (count%2) { // odd number of [*] -> replace last one
            int lastIndex = cap.lastIndexOf(placeHolder, index - 1);
            if (widget->isWindowModified()
             && widget->style()->styleHint(QStyle::SH_TitleBar_ModifyNotification, nullptr, widget))
                cap.replace(lastIndex, 3, QWidget::tr("*"));
            else
                cap.remove(lastIndex, 3);
        }

        index = cap.indexOf(placeHolder, index);
    }

    cap.replace("[*][*]"_L1, placeHolder);

    return cap;
}